

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CovergroupType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CovergroupType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::CovergroupBodySymbol&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          CovergroupBodySymbol *args_3)

{
  string_view name;
  CovergroupType *this_00;
  
  this_00 = (CovergroupType *)allocate(this,0xb0,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::CovergroupType::CovergroupType(this_00,args,name,*args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }